

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O2

int __thiscall jrtplib::RTPPacketBuilder::SetMaximumPacketSize(RTPPacketBuilder *this,size_t max)

{
  int iVar1;
  uint8_t *puVar2;
  RTPMemoryManager *mgr;
  
  if (max != 0) {
    puVar2 = (uint8_t *)operator_new__(max,(this->super_RTPMemoryObject).mgr,9);
    if (puVar2 == (uint8_t *)0x0) {
      iVar1 = -1;
    }
    else {
      RTPDeleteByteArray((jrtplib *)this->buffer,(uint8_t *)(this->super_RTPMemoryObject).mgr,mgr);
      this->buffer = puVar2;
      this->maxpacksize = max;
      iVar1 = 0;
    }
    return iVar1;
  }
  return -0x13;
}

Assistant:

int RTPPacketBuilder::SetMaximumPacketSize(size_t max)
{
	uint8_t *newbuf;

	if (max <= 0)
		return ERR_RTP_PACKBUILD_INVALIDMAXPACKETSIZE;
	newbuf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTPPACKETBUILDERBUFFER) uint8_t[max];
	if (newbuf == 0)
		return ERR_RTP_OUTOFMEM;
	
	RTPDeleteByteArray(buffer,GetMemoryManager());
	buffer = newbuf;
	maxpacksize = max;
	return 0;
}